

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

BtorSimBitVector * btorsim_bv_redor(BtorSimBitVector *bv)

{
  BtorSimBitVector *pBVar1;
  uint uVar2;
  
  pBVar1 = btorsim_bv_new(1);
  if (bv->len != 0) {
    uVar2 = 0;
    do {
      if ((&bv[1].width)[uVar2] != 0) {
        (&pBVar1[1].width)[pBVar1->len - 1] = (&pBVar1[1].width)[pBVar1->len - 1] | 1;
        return pBVar1;
      }
      uVar2 = uVar2 + 1;
    } while (bv->len != uVar2);
  }
  (&pBVar1[1].width)[pBVar1->len - 1] = (&pBVar1[1].width)[pBVar1->len - 1] & 0xfffffffe;
  return pBVar1;
}

Assistant:

BtorSimBitVector *
btorsim_bv_redor (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i;
  uint32_t bit;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  assert (rem_bits_zero_dbg (res));
  bit = 0;
  for (i = 0; !bit && i < bv->len; i++)
    if (bv->bits[i]) bit = 1;

  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}